

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

ImplicitWeakMessage * __thiscall
google::protobuf::Arena::DoCreateMessage<google::protobuf::internal::ImplicitWeakMessage>
          (Arena *this)

{
  ImplicitWeakMessage *this_00;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar1;
  
  pVar1 = AllocateAlignedWithCleanup
                    (this,0x30,(type_info *)&internal::ImplicitWeakMessage::typeinfo);
  this_00 = (ImplicitWeakMessage *)pVar1.first;
  (pVar1.second)->elem = this_00;
  (pVar1.second)->cleanup =
       internal::arena_destruct_object<google::protobuf::internal::ImplicitWeakMessage>;
  internal::ImplicitWeakMessage::ImplicitWeakMessage(this_00,this);
  return this_00;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }